

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::request_face_status(ArrayKernel *this)

{
  uint uVar1;
  allocator local_31;
  string local_30 [32];
  ArrayKernel *local_10;
  ArrayKernel *this_local;
  
  uVar1 = this->refcount_fstatus_;
  this->refcount_fstatus_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"f:status",&local_31);
    BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
              (&this->super_BaseKernel,&this->face_status_,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void request_face_status()
  {
    if (!refcount_fstatus_++)
      add_property( face_status_, "f:status" );
  }